

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.hpp
# Opt level: O2

void __thiscall BinarySearchTree<int>::~BinarySearchTree(BinarySearchTree<int> *this)

{
  __shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)this,&local_18
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  this->size_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->root_).
              super___shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~BinarySearchTree()
    {
        root_ = nullptr;
        size_ = 0;
    }